

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre_test.cc
# Opt level: O1

void re2::MimicsPCRESimpleTests(void)

{
  char cVar1;
  char *__s;
  int iVar2;
  bool bVar3;
  size_t sVar4;
  Regexp *this;
  long lVar5;
  char *pcVar6;
  int iVar7;
  char *local_1b0;
  ostream local_1a8 [376];
  
  lVar5 = 0;
  do {
    __s = (&tests)[lVar5 * 2];
    iVar7 = 1;
    do {
      local_1b0 = __s;
      if (__s == (char *)0x0) {
        local_1a8[0] = (ostringstream)0x0;
        local_1a8._1_3_ = 0;
      }
      else {
        sVar4 = strlen(__s);
        local_1a8._0_4_ = (undefined4)sVar4;
      }
      this = Regexp::Parse((StringPiece *)&local_1b0,(uint)(iVar7 == 1) << 5 | LikePerl,
                           (RegexpStatus *)0x0);
      iVar2 = (int)local_1a8;
      if (this == (Regexp *)0x0) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x43,3);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Check failed: re",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)
                                        (CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar4);
        }
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      cVar1 = (&DAT_00128178)[lVar5 * 0x10];
      bVar3 = Regexp::MimicsPCRE(this);
      if ((bool)cVar1 != bVar3) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/mimics_pcre_test.cc"
                   ,0x44,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Check failed: (t.should_match) == (re->MimicsPCRE())",0x34);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        if (__s == (char *)0x0) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)
                                        (CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18));
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,__s,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
        pcVar6 = "utf";
        if (iVar7 == 1) {
          pcVar6 = "latin1";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,pcVar6,(ulong)(iVar7 == 1) * 3 + 3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      Regexp::Decref(this);
      iVar7 = iVar7 + -1;
    } while (iVar7 == 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1f);
  return;
}

Assistant:

TEST(MimicsPCRE, SimpleTests) {
  for (int i = 0; i < arraysize(tests); i++) {
    const PCRETest& t = tests[i];
    for (int j = 0; j < 2; j++) {
      Regexp::ParseFlags flags = Regexp::LikePerl;
      if (j == 0)
        flags = flags | Regexp::Latin1;
      Regexp* re = Regexp::Parse(t.regexp, flags, NULL);
      CHECK(re) << " " << t.regexp;
      CHECK_EQ(t.should_match, re->MimicsPCRE())
        << " " << t.regexp << " "
        << (j==0 ? "latin1" : "utf");
      re->Decref();
    }
  }
}